

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_fft.hpp
# Opt level: O0

void __thiscall
re::fft::simd_fft<float,_256L>::set_twiddles(simd_fft<float,_256L> *this,int_t stage)

{
  reference pvVar1;
  byte in_SIL;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  int i;
  int_t stride;
  int n;
  size_type in_stack_ffffffffffffffb8;
  array<std::complex<float>,_128UL> *in_stack_ffffffffffffffc0;
  int local_24;
  
  remainder(in_XMM0_Qa,in_XMM1_Qa);
  for (local_24 = 0; local_24 < 1 << (in_SIL & 0x1f); local_24 = local_24 + 1) {
    in_stack_ffffffffffffffc0 =
         (array<std::complex<float>,_128UL> *)
         std::array<std::complex<float>,_128UL>::operator[]
                   (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    pvVar1 = std::array<std::complex<float>,_128UL>::operator[]
                       (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    pvVar1->_M_value = in_stack_ffffffffffffffc0->_M_elems[0]._M_value;
  }
  return;
}

Assistant:

void set_twiddles(int_t stage) noexcept {
        auto const n = 1 << stage;
        auto const stride = remainder() >> stage;

        for (auto i = 0; i < n; ++i) {
            w_twiddles[i] = twiddles[i * stride];
        }
        /*
        for (auto i = 1; i * n < simd::width<cpx_t>; ++i) {
            for (auto j = 0; j < n; ++j) {
                w_twiddles[i * n + j] = w_twiddles[j];
            }
        }
         */
    }